

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O1

string * __thiscall POSG::SoftPrint_abi_cxx11_(string *__return_storage_ptr__,POSG *this)

{
  double *pdVar1;
  pointer prVar2;
  ostream *poVar3;
  double *pdVar4;
  pointer prVar5;
  stringstream ss_1;
  stringstream ss_2;
  stringstream ss;
  long *local_510;
  long local_508;
  long local_500 [2];
  long *local_4f0;
  long local_4e8;
  long local_4e0 [2];
  string *local_4d0;
  stringstream local_4c8 [16];
  ostream local_4b8 [112];
  ios_base local_448 [264];
  stringstream local_340 [16];
  ostream local_330 [112];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_4d0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Discount factors: ",0x12);
  std::__cxx11::stringstream::stringstream(local_4c8);
  pdVar4 = (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8,"< ",2);
  if (pdVar4 != pdVar1) {
    do {
      if (pdVar4 != (this->_m_discount).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(local_4b8,", ",2);
      }
      std::__cxx11::stringstream::stringstream(local_340);
      std::ostream::_M_insert<double>(*pdVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)local_510,local_508);
      if (local_510 != local_500) {
        operator_delete(local_510,local_500[0] + 1);
      }
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8," >",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(local_448);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_4f0,local_4e8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0,local_4e0[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Reward type: ",0xd);
  std::__cxx11::stringstream::stringstream(local_4c8);
  prVar5 = (this->_m_rewardType).
           super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  prVar2 = (this->_m_rewardType).
           super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8,"< ",2);
  if (prVar5 != prVar2) {
    do {
      if (prVar5 != (this->_m_rewardType).
                    super__Vector_base<Globals::reward_t,_std::allocator<Globals::reward_t>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>(local_4b8,", ",2);
      }
      std::__cxx11::stringstream::stringstream(local_340);
      std::ostream::operator<<(local_330,*prVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_340);
      std::ios_base::~ios_base(local_2c0);
      std::__ostream_insert<char,std::char_traits<char>>(local_4b8,(char *)local_510,local_508);
      if (local_510 != local_500) {
        operator_delete(local_510,local_500[0] + 1);
      }
      prVar5 = prVar5 + 1;
    } while (prVar5 != prVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_4b8," >",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_4c8);
  std::ios_base::~ios_base(local_448);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_4f0,local_4e8)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0,local_4e0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return local_4d0;
}

Assistant:

string POSG::SoftPrint() const
{
    stringstream ss;
    ss << "Discount factors: " << 
        PrintTools::SoftPrintVector(_m_discount) << endl;
    ss << "Reward type: " << 
        PrintTools::SoftPrintVector(_m_rewardType) << endl;
    return ss.str();
}